

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O3

void __thiscall
Js::EngineInterfaceObject::SetEngineExtension
          (EngineInterfaceObject *this,EngineInterfaceExtensionKind extensionKind,
          EngineExtensionObjectBase *extensionObject)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *addr;
  
  if (EngineInterfaceExtensionKind_WinRTPromise < extensionKind) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x5a,
                                "(extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind)"
                                ,
                                "extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind"
                               );
    if (!bVar2) goto LAB_00b40f5a;
    *puVar3 = 0;
    if (2 < (int)extensionKind) {
      return;
    }
  }
  if (this->engineExtensions[extensionKind].ptr != (EngineExtensionObjectBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                ,0x5d,"(engineExtensions[extensionKind] == nullptr)",
                                "engineExtensions[extensionKind] == nullptr");
    if (!bVar2) {
LAB_00b40f5a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = this->engineExtensions + extensionKind;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = extensionObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if ((this->commonNativeInterfaces).ptr == (DynamicObject *)0x0) {
    return;
  }
  (**extensionObject->_vptr_EngineExtensionObjectBase)(extensionObject);
  return;
}

Assistant:

void EngineInterfaceObject::SetEngineExtension(EngineInterfaceExtensionKind extensionKind, EngineExtensionObjectBase* extensionObject)
    {
        AnalysisAssert(extensionKind >= 0 && extensionKind <= MaxEngineInterfaceExtensionKind);
        if (extensionKind <= MaxEngineInterfaceExtensionKind)
        {
            Assert(engineExtensions[extensionKind] == nullptr);
            engineExtensions[extensionKind] = extensionObject;

            // Init the extensionObject if this was already initialized
            if (this->IsInitialized())
            {
                extensionObject->Initialize();
            }
        }
    }